

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_iconst_m1(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand.data.longValue = 0xffffffff;
  operand.printType = INT;
  operand.type = INT;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_iconst_m1() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value;
    value.printType = ValueType::INT;
    value.type = ValueType::INT;
    value.data.intValue = -1;

    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}